

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O3

void __thiscall NaStateSpaceModel::Load(NaStateSpaceModel *this)

{
  NaDataStream *in_RSI;
  
  Load((NaStateSpaceModel *)&this[-1].x.pVect,in_RSI);
  return;
}

Assistant:

void
NaStateSpaceModel::Load (NaDataStream& ds)
{
    char        *szBuf, *s, *p;
    unsigned     i, j;

    ds.GetF("%u %u %u", &n, &m, &k);
    NaPrintLog("N=%d  M=%d  K=%d\n", n, m, k);

    A.new_dim(n, n);
    for(i = 0; i < A.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < A.dim_cols(); ++j){
            A[i][j] = strtod(s, &p);
            s = p;
        }
    }
    A.print_contents();

    B.new_dim(n, k);
    for(i = 0; i < B.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < B.dim_cols(); ++j){
            B[i][j] = strtod(s, &p);
            s = p;
        }
    }
    B.print_contents();

    C.new_dim(m, n);
    for(i = 0; i < C.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < C.dim_cols(); ++j){
            C[i][j] = strtod(s, &p);
            s = p;
        }
    }
    C.print_contents();

    D.new_dim(m, k);
    for(i = 0; i < D.dim_rows(); ++i){
        szBuf = ds.GetData();
        s = szBuf;
        for(j = 0; j < D.dim_cols(); ++j){
            D[i][j] = strtod(s, &p);
            s = p;
        }
    }
    D.print_contents();

    // Just to have right dimension
    x.new_dim(n);

    x0.new_dim(n);
    szBuf = ds.GetData();
    s = szBuf;
    for(i = 0; i < x0.dim(); ++i){
	x0[i] = strtod(s, &p);
	s = p;
    }
    x0.print_contents();

    Assign(k, m);
}